

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2.c
# Opt level: O2

char * curl_pushheader_bynum(curl_pushheaders *h,size_t num)

{
  Curl_easy *pCVar1;
  HTTP *pHVar2;
  
  if ((((h != (curl_pushheaders *)0x0) && (pCVar1 = h->data, pCVar1 != (Curl_easy *)0x0)) &&
      (pCVar1->magic == 0xc0dedbad)) &&
     (pHVar2 = (pCVar1->req).p.http, num < pHVar2->push_headers_used)) {
    return pHVar2->push_headers[num];
  }
  return (char *)0x0;
}

Assistant:

char *curl_pushheader_bynum(struct curl_pushheaders *h, size_t num)
{
  /* Verify that we got a good easy handle in the push header struct, mostly to
     detect rubbish input fast(er). */
  if(!h || !GOOD_EASY_HANDLE(h->data))
    return NULL;
  else {
    struct HTTP *stream = h->data->req.p.http;
    if(num < stream->push_headers_used)
      return stream->push_headers[num];
  }
  return NULL;
}